

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O1

void __thiscall winmd::reader::ParamSig::ParamSig(ParamSig *this,table_base *table,byte_view *data)

{
  ElementType EVar1;
  vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *result;
  byte_view cursor;
  byte_view local_48;
  table_base *local_30;
  
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_first = data->m_first;
  local_48.m_last = data->m_last;
  local_30 = table;
  EVar1 = uncompress_enum<winmd::reader::ElementType>(&local_48);
  while ((byte)(EVar1 - CModReqd) < 2) {
    std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>> *)
               this,&local_30,data);
    local_48.m_first = data->m_first;
    local_48.m_last = data->m_last;
    EVar1 = uncompress_enum<winmd::reader::ElementType>(&local_48);
  }
  local_48.m_first = data->m_first;
  local_48.m_last = data->m_last;
  EVar1 = uncompress_enum<winmd::reader::ElementType>(&local_48);
  if (EVar1 == ByRef) {
    data->m_first = local_48.m_first;
    data->m_last = local_48.m_last;
  }
  this->m_byref = EVar1 == ByRef;
  TypeSig::TypeSig(&this->m_type,table,data);
  return;
}

Assistant:

ParamSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
            , m_type(table, data)
        {
        }